

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O2

int sf(frameex1 *fx_addr68k)

{
  int iVar1;
  ushort uVar2;
  bool bVar3;
  LispPTR LVar4;
  DLword *NAddr;
  DLword offset;
  LispPTR *NAddr_00;
  LispPTR *pLVar5;
  int localivar;
  
  BT_lines = 0;
  if (fx_addr68k != (frameex1 *)0x0) {
    if ((*(ushort *)&fx_addr68k->field_0x2 & 0xe000) != 0xc000) {
      LVar4 = LAddrFromNative(fx_addr68k);
      printf("Invalid FX 0x%x, flags = 0x%x.\n",(ulong)LVar4,
             (ulong)(*(ushort *)&fx_addr68k->field_0x2 >> 0xd));
      return -1;
    }
    if ((fx_addr68k->alink & 1) == 0) {
      NAddr = &fx_addr68k[-1].clink;
    }
    else {
      uVar2 = fx_addr68k->blink;
      if ((uVar2 & 1) != 0) {
        printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)(uint)uVar2)
        ;
      }
      NAddr = (DLword *)((ulong)((uint)uVar2 * 2) + (long)Stackspace);
    }
    puts("IVAR -------");
    iVar1 = BT_lines + 1;
    bVar3 = 0x1d < BT_lines;
    BT_lines = iVar1;
    if (bVar3) {
      printf("Press Return(to quit Esc and Ret):");
      BT_temp = getchar();
      fflush(_stdin);
      BT_lines = 0;
      if (BT_temp == 0x1b) goto LAB_00112c2f;
    }
    offset = 0;
    NAddr_00 = (LispPTR *)((ulong)((uint)*NAddr * 2) + (long)Stackspace);
    pLVar5 = NAddr_00;
    for (; NAddr_00 != (LispPTR *)NAddr; NAddr_00 = NAddr_00 + 1) {
      LVar4 = LAddrFromNative(NAddr_00);
      printf(" %6x : 0x%4x  0x%4x  ",(ulong)LVar4,(ulong)*(ushort *)((ulong)pLVar5 ^ 2),
             (ulong)*(ushort *)((ulong)((long)pLVar5 + 2U) ^ 2));
      LVar4 = get_ivar_name(fx_addr68k,offset,&localivar);
      if (localivar == 1) {
        printf("*local* ");
      }
      print_atomname(LVar4);
      printf("  ");
      print(*NAddr_00);
      putchar(10);
      iVar1 = BT_lines + 1;
      bVar3 = 0x1d < BT_lines;
      BT_lines = iVar1;
      if (bVar3) {
        printf("Press Return(to quit Esc and Ret):");
        BT_temp = getchar();
        fflush(_stdin);
        BT_lines = 0;
        if (BT_temp == 0x1b) goto LAB_00112c2f;
      }
      pLVar5 = pLVar5 + 1;
      offset = offset + 1;
    }
    putchar(10);
    iVar1 = BT_lines + 1;
    bVar3 = 0x1d < BT_lines;
    BT_lines = iVar1;
    if (bVar3) {
      printf("Press Return(to quit Esc and Ret):");
      BT_temp = getchar();
      fflush(_stdin);
      BT_lines = 0;
      if (BT_temp == 0x1b) goto LAB_00112c2f;
    }
    LVar4 = LAddrFromNative(NAddr);
    printf("## STACK BF at 0x%x ##\n",(ulong)LVar4);
    iVar1 = BT_lines + 1;
    bVar3 = 0x1d < BT_lines;
    BT_lines = iVar1;
    if (bVar3) {
      printf("Press Return(to quit Esc and Ret):");
      BT_temp = getchar();
      fflush(_stdin);
      BT_lines = 0;
      if (BT_temp == 0x1b) {
LAB_00112c2f:
        BT_lines = 0;
        longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
      }
    }
    puts("Invalid frame, NOT a BX");
  }
  return -1;
}

Assistant:

int sf(struct frameex1 *fx_addr68k) {
  Bframe *bf;
  DLword *next68k;
  DLword *ptr;
  DLword *ptrhi;
  DLword *ptrlo;
  LispPTR atomindex;
  int i;
  DLword npvar;
  DLword max_npvar;
  LispPTR pvarindex;
  DLword nfvar;
  struct fnhead *fnobj;
  int localivar;
  LispPTR ivarindex;

  BT_lines = 0;

  if ((UNSIGNED)fx_addr68k == 0) return (-1);
  if ((fx_addr68k)->flags != STK_FX) {
    printf("Invalid FX 0x%x, flags = 0x%x.\n", LAddrFromNative(fx_addr68k), (fx_addr68k)->flags);
    return (-1);
  }

  if (((fx_addr68k)->alink & 1) == 0) { /* FAST */
    bf = (Bframe *)(((DLword *)fx_addr68k) - 2);
  } else { /* SLOW */
    bf = (Bframe *)NativeAligned4FromStackOffset((fx_addr68k)->blink);
  }

  /* Print IVARs */
  printf("IVAR -------\n");
  BT_morep;

  ptr = NativeAligned2FromStackOffset(bf->ivar);
  i = 0;
  while (ptr != (DLword *)bf) {
    ptrlo = ptr + 1;
    printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptrlo));
    ivarindex = get_ivar_name(fx_addr68k, i++, &localivar);
    if (localivar == 1) printf("*local* ");
    print_atomname(ivarindex);
    printf("  ");
    print(*(LispPTR *)ptr);
    putchar('\n');
    BT_morep;
    ptr += 2;
  }
  putchar('\n');
  BT_morep;
  printf("## STACK BF at 0x%x ##\n", (LispPTR)LAddrFromNative(bf));
  BT_morep;

  /* print BF  */
  if (bf->flags != 4) {
    printf("Invalid frame, NOT a BX\n");
    return (-1);
  }
  putchar('[');
  if (bf->residual) printf("Res, ");
  if (bf->padding) printf("Pad, ");
  printf("cnt=%d ]\n", bf->usecnt);
  BT_morep;
  printf("ivar : 0x%x\n", bf->ivar);
  BT_morep;

  printf(">> Bf's ivar says 0x%x vs. IVar says 0x%x\n", bf->ivar + STK_OFFSET,
         LAddrFromNative(IVar));
  BT_morep;

  atomindex = get_framename(fx_addr68k);
  printf("Fname is ");
  print(atomindex);
  printf("\n");
  BT_morep;

  /***** printout FX ****/
  printf("## STACK FX at 0x%x ##\n", LAddrFromNative(fx_addr68k));
  BT_morep;

  if ((fx_addr68k)->flags != 6) {
    printf("Invalid frame, NOT FX\n");
    return (-1);
  }

  putchar('[');
  if ((fx_addr68k)->fast) printf("F, ");
  if ((fx_addr68k)->incall) printf("incall, ");
  if (fx_addr68k->validnametable) printf("V, ");
  printf("cnt = %d ]\n", fx_addr68k->usecount);
  BT_morep;

  printf(" #alink           0x%x ", fx_addr68k->alink);

  if (fx_addr68k->alink & 1)
    printf("[SLOWP]\n");
  else
    printf("\n");

  BT_morep;

#ifdef BIGVM
  printf(" fnhead   0x%x \n", fx_addr68k->fnheader);
  BT_morep;
#else
  printf(" fnheadlo         0x%x \n", fx_addr68k->lofnheader);
  BT_morep;
  printf(" hi1,hi2 fnhead   0x%x , 0x%x \n", fx_addr68k->hi1fnheader, fx_addr68k->hi2fnheader);
  BT_morep;
#endif /* BIGVM */
  printf(" nextblock        0x%x \n", fx_addr68k->nextblock);
  BT_morep;
  printf(" pc               0x%x \n", fx_addr68k->pc);
  BT_morep;
#ifdef BIGVM
  printf(" nametbl  0x%x \n", fx_addr68k->nametable);
  BT_morep;
#else
  printf(" lonametbl        0x%x \n", fx_addr68k->lonametable);
  BT_morep;
  printf(" hi1,hi2 nametbl  0x%x , 0x%x  \n", fx_addr68k->hi1nametable, fx_addr68k->hi2nametable);
  BT_morep;
#endif /* BIGVM */
  printf(" #blink           0x%x \n", fx_addr68k->blink);
  BT_morep;
  printf(" #clink           0x%x \n", fx_addr68k->clink);
  BT_morep;

/* added by NMitani 26 Aug 87 */

#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx_addr68k->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)fx_addr68k->hi2fnheader << 16) |
                                              fx_addr68k->lofnheader);
#endif                                /* BIGVM */
  max_npvar = npvar = fnobj->nlocals; /* npvar is number of Pvars */
  if (fnobj->fvaroffset)
#ifdef BIGATOMS
    nfvar = *((NAMETABLE *)((DLword *)fnobj + fnobj->fvaroffset + fnobj->ntsize)) & NT_OFFSET_MASK;
#else
    nfvar = GETWORD((NAMETABLE *)((DLword *)fnobj + fnobj->fvaroffset + fnobj->ntsize)) &
            NT_OFFSET_MASK;
#endif /* BIGATOMS */

  else
    nfvar = 0;

  if (fx_addr68k == CURRENTFX) {
    ptr = PVar;
    i = 0;
    while (npvar-- > 0) {
      ptrhi = ptr;
      ptrlo = ptr + 1;
      printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
      if ((pvarindex = get_pvar_name(fx_addr68k, i++)) == LOCAL_PVAR)
        printf("*local* [pvar%d] ", (i - 1));
      else
        print_atomname(pvarindex);
      if (GETWORD(ptr) == 0xFFFF) {
        printf("  [variable not bound]\n");
        BT_morep;
      } else {
        printf("  ");
        print(*(LispPTR *)ptr);
        putchar('\n');
        BT_morep;
      }
      ptr += 2;
    }
    i = max_npvar;
    while (nfvar && nfvar-- >= max_npvar) {
      ptrhi = ptr;
      ptrlo = ptr + 1;
      printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
      if (0xFFFF == GETWORD(ptrhi)) {
        printf("[not looked up]  ");
        print_atomname(get_fvar_name(fx_addr68k, i));
        putchar('\n');
        BT_morep;
      } else if ((0xFFFF & GETWORD(ptrlo)) == 1) {
        printf("[fvar  ");
        print_atomname(get_fvar_name(fx_addr68k, i));
        printf("  on stack]  ");
        print(*(LispPTR *)NativeAligned4FromLAddr(((int)(0x0F & GETWORD(ptrlo)) << 16) | GETWORD(ptrhi)));
        putchar('\n');
        BT_morep;
      } else {
        printf("[fvar  ");
        print_atomname(get_fvar_name(fx_addr68k, i));
        printf("  top value ]   ");
        print(*(LispPTR *)NativeAligned4FromLAddr(((int)(0xFFF & GETWORD(ptrlo)) << 16) | GETWORD(ptrhi)));
        putchar('\n');
        BT_morep;
      }
      ptr += 2;
      i++;
    }
    if (fx_addr68k->alink == 11) /* for contextsw */
      next68k = NativeAligned2FromStackOffset(fx_addr68k->nextblock);

    else
      next68k = CurrentStackPTR;
    while (ptr < next68k) {
      ptrhi = ptr;
      ptrlo = ptr + 1;
      printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
      print(*(LispPTR *)ptr);
      ptr += 2;
      putchar('\n');
      BT_morep;
    }
    printf("this frame is last !!\n");
    BT_morep;
    return (-1);
  }

  next68k = NativeAligned2FromStackOffset(fx_addr68k->nextblock);
  ptr = (DLword *)(fx_addr68k + 1);

  i = 0;
  while (npvar-- > 0) {
    ptrhi = ptr;
    ptrlo = ptr + 1;
    printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
    if ((pvarindex = get_pvar_name(fx_addr68k, i++)) == LOCAL_PVAR)
      printf("*local* [pvar%d] ", (i - 1));
    else
      print_atomname(pvarindex);
    if (GETWORD(ptr) == 0xFFFF) {
      printf("  [variable not bound]\n");
      BT_morep;
    } else {
      printf("  ");
      print(*(LispPTR *)ptr);
      putchar('\n');
      BT_morep;
    }
    ptr += 2;
  }
  i = max_npvar;

  while (nfvar && nfvar-- >= max_npvar) {
    ptrhi = ptr;
    ptrlo = ptr + 1;
    printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
    if (0xFFFF == GETWORD(ptrhi)) {
      printf("[not looked up]  ");
      print_atomname(get_fvar_name(fx_addr68k, i));
      putchar('\n');
      BT_morep;
    } else if ((0xFFFF & GETWORD(ptrlo)) == 1) {
      printf("[fvar  ");
      print_atomname(get_fvar_name(fx_addr68k, i));
      printf("  on stack]  ");
      print(*(LispPTR *)NativeAligned4FromLAddr(((int)(0x0F & GETWORD(ptrlo)) << 16) | GETWORD(ptrhi)));
      putchar('\n');
      BT_morep;
    } else {
      printf("[fvar  ");
      print_atomname(get_fvar_name(fx_addr68k, i));
      printf("  top value ]   ");
      print(*(LispPTR *)NativeAligned4FromLAddr(((int)(0x0F & GETWORD(ptrlo)) << 16) | GETWORD(ptrhi)));
      putchar('\n');
      BT_morep;
    }
    ptr += 2;
    i++;
  }

  while (next68k > ptr) {
    ptrhi = ptr;
    ptrlo = ptr + 1;
    printf(" %6x : 0x%4x  0x%4x  ", LAddrFromNative(ptr), GETWORD(ptrhi), GETWORD(ptrlo));
    putchar('\n');
    BT_morep;
    ptr += 2;
  }
  return (0);
}